

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_xml_generator.cc
# Opt level: O0

void __thiscall t_xml_generator::generate_program(t_xml_generator *this)

{
  string local_108;
  allocator local_e1;
  string local_e0;
  allocator local_b9;
  string local_b8;
  allocator local_91;
  string local_90;
  allocator local_69;
  string local_68;
  allocator local_31;
  string local_30;
  t_xml_generator *local_10;
  t_xml_generator *this_local;
  
  local_10 = this;
  (*(this->super_t_generator)._vptr_t_generator[0xf])();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"idl",&local_31);
  write_element_start(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  if ((this->should_use_namespaces_ & 1U) != 0) {
    if ((this->should_use_default_ns_ & 1U) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_68,"xmlns",&local_69);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_90,"http://thrift.apache.org/xml/idl",&local_91)
      ;
      write_attribute(this,&local_68,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::allocator<char>::~allocator((allocator<char> *)&local_91);
      std::__cxx11::string::~string((string *)&local_68);
      std::allocator<char>::~allocator((allocator<char> *)&local_69);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_b8,"xmlns:idl",&local_b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_e0,"http://thrift.apache.org/xml/idl",&local_e1);
    write_attribute(this,&local_b8,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_e1);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  }
  (*(this->super_t_generator)._vptr_t_generator[0x1f])();
  write_xml_comment(this,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  iterate_program(this,(this->super_t_generator).program_);
  write_element_end(this);
  (*(this->super_t_generator)._vptr_t_generator[0x10])();
  return;
}

Assistant:

void t_xml_generator::generate_program() {

  init_generator();

  write_element_start("idl");
  if (should_use_namespaces_) {
    if (should_use_default_ns_) {
      write_attribute("xmlns", "http://thrift.apache.org/xml/idl");
    }
    write_attribute("xmlns:idl", "http://thrift.apache.org/xml/idl");
  }

  write_xml_comment( xml_autogen_comment());

  iterate_program(program_);

  write_element_end();

  close_generator();

}